

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

void __thiscall TApp_AddingComplexParser_Test::TestBody(TApp_AddingComplexParser_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  AssertHelper local_160;
  Message local_158;
  double local_150;
  double local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  double local_120;
  double local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  iterator local_90;
  size_type local_88;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  cx comp;
  TApp_AddingComplexParser_Test *this_local;
  
  comp._M_value._8_8_ = this;
  CLI::std::complex<double>::complex((complex<double> *)local_20,0.0,0.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"-c,--complex",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  add_option(&(this->super_TApp).app,&local_40,(cx *)local_20,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  gtest_ar.message_.ptr_._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"-c",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"1.5",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"2.5",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  gtest_ar.message_.ptr_._4_1_ = 0;
  local_90 = &local_f0;
  local_88 = 3;
  __l._M_len = 3;
  __l._M_array = local_90;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90;
  do {
    local_1b8 = local_1b8 + -1;
    std::__cxx11::string::~string((string *)local_1b8);
  } while (local_1b8 != &local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_118 = 1.5;
  local_120 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_20);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_110,"1.5","comp.real()",&local_118,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_148 = 2.5;
  local_150 = std::complex<double>::imag_abi_cxx11_((complex<double> *)local_20);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_140,"2.5","comp.imag()",&local_148,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  return;
}

Assistant:

TEST_F(TApp, AddingComplexParser) {

    cx comp{0, 0};
    add_option(app, "-c,--complex", comp);
    args = {"-c", "1.5", "2.5"};

    run();

    EXPECT_EQ(1.5, comp.real());
    EXPECT_EQ(2.5, comp.imag());
}